

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int QEMU_AES_set_encrypt_key(uchar *userKey,int bits,AES_KEY *key)

{
  uint uVar1;
  int iVar2;
  uint32_t *puVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = -1;
  if ((key != (AES_KEY *)0x0 && userKey != (uchar *)0x0) &&
     (((bits == 0x80 || (bits == 0x100)) || (iVar2 = -2, bits == 0xc0)))) {
    if (bits == 0x80) {
      key->rounds = 10;
    }
    else if (bits == 0xc0) {
      key->rounds = 0xc;
    }
    else {
      key->rounds = 0xe;
    }
    uVar1 = *(uint *)userKey;
    key->rd_key[0] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    uVar1 = *(uint *)(userKey + 4);
    key->rd_key[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    uVar1 = *(uint *)(userKey + 8);
    key->rd_key[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    uVar1 = *(uint *)(userKey + 0xc);
    key->rd_key[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    if (bits == 0x80) {
      iVar2 = 0;
      lVar4 = 0;
      do {
        uVar1 = key->rd_key[lVar4 + 3];
        uVar5 = (uint)(byte)AES_Te4[uVar1 >> 0x18] ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 & 0xff) * 4 + 1) << 8 ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 0xe & 0x3fc) + 3) << 0x18 ^
                key->rd_key[lVar4] ^ *(uint *)((long)rcon + lVar4);
        key->rd_key[lVar4 + 4] = uVar5;
        uVar5 = uVar5 ^ key->rd_key[lVar4 + 1];
        key->rd_key[lVar4 + 5] = uVar5;
        uVar5 = uVar5 ^ key->rd_key[lVar4 + 2];
        key->rd_key[lVar4 + 6] = uVar5;
        key->rd_key[lVar4 + 7] = uVar5 ^ uVar1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x28);
    }
    else {
      uVar1 = *(uint *)(userKey + 0x10);
      key->rd_key[4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = *(uint *)(userKey + 0x14);
      key->rd_key[5] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (bits == 0xc0) {
        puVar3 = key->rd_key + 0xb;
        iVar2 = 0;
        lVar4 = 0;
        while( true ) {
          uVar1 = puVar3[-6];
          uVar5 = (uint)(byte)AES_Te4[uVar1 >> 0x18] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 0xe & 0x3fc) + 3) << 0x18 ^
                  ((AES_KEY *)(puVar3 + -0xb))->rd_key[0] ^ *(uint *)((long)rcon + lVar4);
          puVar3[-5] = uVar5;
          uVar5 = uVar5 ^ puVar3[-10];
          puVar3[-4] = uVar5;
          uVar5 = uVar5 ^ puVar3[-9];
          puVar3[-3] = uVar5;
          uVar5 = uVar5 ^ puVar3[-8];
          puVar3[-2] = uVar5;
          if (lVar4 == 0x1c) break;
          uVar5 = uVar5 ^ puVar3[-7];
          puVar3[-1] = uVar5;
          *puVar3 = uVar5 ^ uVar1;
          lVar4 = lVar4 + 4;
          puVar3 = puVar3 + 6;
        }
      }
      else {
        uVar1 = *(uint *)(userKey + 0x18);
        key->rd_key[6] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = *(uint *)(userKey + 0x1c);
        key->rd_key[7] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        if (bits != 0x100) {
          abort();
        }
        iVar2 = 0;
        lVar4 = 0;
        while( true ) {
          uVar1 = key->rd_key[lVar4 * 2 + 7];
          uVar5 = (uint)(byte)AES_Te4[uVar1 >> 0x18] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar1 >> 0xe & 0x3fc) + 3) << 0x18 ^
                  key->rd_key[lVar4 * 2] ^ *(uint *)((long)rcon + lVar4);
          key->rd_key[lVar4 * 2 + 8] = uVar5;
          uVar5 = uVar5 ^ key->rd_key[lVar4 * 2 + 1];
          key->rd_key[lVar4 * 2 + 9] = uVar5;
          uVar5 = uVar5 ^ key->rd_key[lVar4 * 2 + 2];
          key->rd_key[lVar4 * 2 + 10] = uVar5;
          uVar5 = uVar5 ^ key->rd_key[lVar4 * 2 + 3];
          key->rd_key[lVar4 * 2 + 0xb] = uVar5;
          if (lVar4 == 0x18) break;
          uVar5 = (uint)(byte)AES_Te4[uVar5 & 0xff] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar5 >> 8 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar5 >> 0xe & 0x3fc) + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar5 >> 0x18) * 4 + 3) << 0x18 ^
                  key->rd_key[lVar4 * 2 + 4];
          key->rd_key[lVar4 * 2 + 0xc] = uVar5;
          uVar5 = uVar5 ^ key->rd_key[lVar4 * 2 + 5];
          key->rd_key[lVar4 * 2 + 0xd] = uVar5;
          uVar5 = uVar5 ^ key->rd_key[lVar4 * 2 + 6];
          key->rd_key[lVar4 * 2 + 0xe] = uVar5;
          key->rd_key[lVar4 * 2 + 0xf] = uVar5 ^ uVar1;
          lVar4 = lVar4 + 4;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int AES_set_encrypt_key(const unsigned char *userKey, const int bits,
                        AES_KEY *key) {

        u32 *rk;
        int i = 0;
        u32 temp;

        if (!userKey || !key)
                return -1;
        if (bits != 128 && bits != 192 && bits != 256)
                return -2;

        rk = key->rd_key;

        if (bits==128)
                key->rounds = 10;
        else if (bits==192)
                key->rounds = 12;
        else
                key->rounds = 14;

        rk[0] = GETU32(userKey     );
        rk[1] = GETU32(userKey +  4);
        rk[2] = GETU32(userKey +  8);
        rk[3] = GETU32(userKey + 12);
        if (bits == 128) {
                while (1) {
                        temp  = rk[3];
                        rk[4] = rk[0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[5] = rk[1] ^ rk[4];
                        rk[6] = rk[2] ^ rk[5];
                        rk[7] = rk[3] ^ rk[6];
                        if (++i == 10) {
                                return 0;
                        }
                        rk += 4;
                }
        }
        rk[4] = GETU32(userKey + 16);
        rk[5] = GETU32(userKey + 20);
        if (bits == 192) {
                while (1) {
                        temp = rk[ 5];
                        rk[ 6] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 7] = rk[ 1] ^ rk[ 6];
                        rk[ 8] = rk[ 2] ^ rk[ 7];
                        rk[ 9] = rk[ 3] ^ rk[ 8];
                        if (++i == 8) {
                                return 0;
                        }
                        rk[10] = rk[ 4] ^ rk[ 9];
                        rk[11] = rk[ 5] ^ rk[10];
                        rk += 6;
                }
        }
        rk[6] = GETU32(userKey + 24);
        rk[7] = GETU32(userKey + 28);
        if (bits == 256) {
                while (1) {
                        temp = rk[ 7];
                        rk[ 8] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 9] = rk[ 1] ^ rk[ 8];
                        rk[10] = rk[ 2] ^ rk[ 9];
                        rk[11] = rk[ 3] ^ rk[10];
                        if (++i == 7) {
                                return 0;
                        }
                        temp = rk[11];
                        rk[12] = rk[ 4] ^
                                (AES_Te4[(temp >> 24)       ] & 0xff000000) ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x000000ff);
                        rk[13] = rk[ 5] ^ rk[12];
                        rk[14] = rk[ 6] ^ rk[13];
                        rk[15] = rk[ 7] ^ rk[14];

                        rk += 8;
                }
        }
        abort();
}